

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdgroupsimple.h
# Opt level: O0

size_t FastPForLib::SIMDGroupSimple<false,_false>::getCountPadBytes(size_t *countSelArea8)

{
  ulong uVar1;
  undefined8 local_18;
  size_t offset;
  size_t *countSelArea8_local;
  
  uVar1 = *countSelArea8 + 0xd & 0xf;
  if (uVar1 == 0) {
    local_18 = 0;
  }
  else {
    local_18 = 0x10 - uVar1;
  }
  return local_18;
}

Assistant:

inline static size_t getCountPadBytes(const size_t &countSelArea8) {
            const size_t offset = (countHeader32 * sizeof(uint32_t) +
                                   countSelArea8 + sizeof(uint8_t)) % sizeof(__m128i);
            return offset ? (sizeof(__m128i) - offset) : 0;
        }